

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O1

void TestDivideModuloIntBignum(void)

{
  bool bVar1;
  uint16_t uVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  Vector<const_char> value;
  Vector<const_char> value_00;
  Vector<const_char> value_01;
  Vector<const_char> value_02;
  Vector<const_char> value_03;
  Vector<const_char> value_04;
  Vector<const_char> value_05;
  Bignum bignum;
  char buffer [1024];
  Bignum other;
  Bignum third;
  undefined8 in_stack_fffffffffffff5c8;
  undefined4 uVar8;
  undefined8 uVar7;
  Bignum local_a2c;
  short local_828;
  undefined1 uStack_826;
  int iStack_825;
  undefined1 uStack_821;
  char local_820;
  Bignum local_420;
  Bignum local_21c;
  
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffff5c8 >> 0x20);
  local_a2c.used_bigits_ = 0;
  local_a2c.exponent_ = 0;
  local_420.used_bigits_ = 0;
  local_420.exponent_ = 0;
  local_21c.used_bigits_ = 0;
  local_21c.exponent_ = 0;
  double_conversion::Bignum::AssignUInt16(&local_a2c,10);
  double_conversion::Bignum::AssignUInt16(&local_420,2);
  uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&local_a2c,&local_420);
  if (uVar2 == 5) {
    bVar1 = double_conversion::Bignum::ToHexString(&local_a2c,(char *)&local_828,0x400);
    if (!bVar1) {
      uVar4 = 0x3e0;
LAB_00824b9d:
      printf("%s:%d:\n CHECK(%s) failed\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum.cc"
             ,uVar4,"bignum.ToHexString(buffer, kBufferSize)");
      abort();
    }
    if (local_828 != 0x30) {
      pcVar3 = "\"0\"";
      pcVar6 = "0";
      uVar4 = 0x3e1;
      goto LAB_00824bd5;
    }
    double_conversion::Bignum::AssignUInt16(&local_a2c,10);
    double_conversion::Bignum::ShiftLeft(&local_a2c,500);
    double_conversion::Bignum::AssignUInt16(&local_420,2);
    double_conversion::Bignum::ShiftLeft(&local_420,500);
    uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&local_a2c,&local_420);
    if (uVar2 == 5) {
      bVar1 = double_conversion::Bignum::ToHexString(&local_a2c,(char *)&local_828,0x400);
      if (!bVar1) {
        uVar4 = 1000;
        goto LAB_00824b9d;
      }
      if (local_828 != 0x30) {
        pcVar3 = "\"0\"";
        pcVar6 = "0";
        uVar4 = 0x3e9;
        goto LAB_00824bd5;
      }
      double_conversion::Bignum::AssignUInt16(&local_a2c,0xb);
      double_conversion::Bignum::AssignUInt16(&local_420,2);
      uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&local_a2c,&local_420);
      if (uVar2 == 5) {
        bVar1 = double_conversion::Bignum::ToHexString(&local_a2c,(char *)&local_828,0x400);
        if (!bVar1) {
          uVar4 = 0x3ee;
          goto LAB_00824b9d;
        }
        if (local_828 != 0x31) {
          pcVar3 = "\"1\"";
          pcVar6 = "1";
          uVar4 = 0x3ef;
          goto LAB_00824bd5;
        }
        double_conversion::Bignum::AssignUInt16(&local_a2c,10);
        double_conversion::Bignum::ShiftLeft(&local_a2c,500);
        double_conversion::Bignum::AssignUInt16(&local_420,1);
        double_conversion::Bignum::AddBignum(&local_a2c,&local_420);
        double_conversion::Bignum::AssignUInt16(&local_420,2);
        double_conversion::Bignum::ShiftLeft(&local_420,500);
        uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&local_a2c,&local_420);
        if (uVar2 == 5) {
          bVar1 = double_conversion::Bignum::ToHexString(&local_a2c,(char *)&local_828,0x400);
          if (!bVar1) {
            uVar4 = 0x3f8;
            goto LAB_00824b9d;
          }
          if (local_828 != 0x31) {
            pcVar3 = "\"1\"";
            pcVar6 = "1";
            uVar4 = 0x3f9;
            goto LAB_00824bd5;
          }
          double_conversion::Bignum::AssignUInt16(&local_a2c,10);
          double_conversion::Bignum::ShiftLeft(&local_a2c,500);
          double_conversion::Bignum::AssignBignum(&local_420,&local_a2c);
          double_conversion::Bignum::MultiplyByUInt32(&local_a2c,0x1234);
          double_conversion::Bignum::AssignUInt16(&local_21c,0xfff);
          double_conversion::Bignum::AddBignum(&local_a2c,&local_21c);
          uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&local_a2c,&local_420);
          if (uVar2 != 0x1234) {
            uVar7 = CONCAT44(uVar8,(uint)uVar2);
            uVar4 = 0x401;
LAB_00824af5:
            pcVar3 = "0x1234";
            uVar5 = 0x1234;
            goto LAB_00824b77;
          }
          bVar1 = double_conversion::Bignum::ToHexString(&local_a2c,(char *)&local_828,0x400);
          if (!bVar1) {
            uVar4 = 0x402;
            goto LAB_00824b9d;
          }
          if (CONCAT13((undefined1)iStack_825,CONCAT12(uStack_826,local_828)) != 0x464646) {
            pcVar3 = "\"FFF\"";
            pcVar6 = "FFF";
            uVar4 = 0x403;
            goto LAB_00824bd5;
          }
          double_conversion::Bignum::AssignUInt16(&local_a2c,10);
          value._8_8_ = 10;
          value.start_ = "1234567890";
          double_conversion::Bignum::AssignHexString(&local_420,value);
          uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&local_a2c,&local_420);
          if (uVar2 == 0) {
            bVar1 = double_conversion::Bignum::ToHexString(&local_a2c,(char *)&local_828,0x400);
            if (!bVar1) {
              uVar4 = 0x408;
              goto LAB_00824b9d;
            }
            if (local_828 != 0x41) {
              pcVar3 = "\"A\"";
              pcVar6 = "A";
              uVar4 = 0x409;
              goto LAB_00824bd5;
            }
            value_00._8_8_ = 8;
            value_00.start_ = "12345678";
            double_conversion::Bignum::AssignHexString(&local_a2c,value_00);
            value_01._8_8_ = 7;
            value_01.start_ = "3789012";
            double_conversion::Bignum::AssignHexString(&local_420,value_01);
            uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&local_a2c,&local_420);
            if (uVar2 != 5) {
              uVar7 = CONCAT44(uVar8,(uint)uVar2);
              uVar4 = 0x40d;
              goto LAB_00824972;
            }
            bVar1 = double_conversion::Bignum::ToHexString(&local_a2c,(char *)&local_828,0x400);
            if (!bVar1) {
              uVar4 = 0x40e;
              goto LAB_00824b9d;
            }
            if (iStack_825 != 0x453136 ||
                CONCAT13((undefined1)iStack_825,CONCAT12(uStack_826,local_828)) != 0x36383944) {
              pcVar3 = "\"D9861E\"";
              pcVar6 = "D9861E";
              uVar4 = 0x40f;
              goto LAB_00824bd5;
            }
            value_02._8_8_ = 8;
            value_02.start_ = "70000001";
            double_conversion::Bignum::AssignHexString(&local_a2c,value_02);
            value_03._8_8_ = 8;
            value_03.start_ = "1FFFFFFF";
            double_conversion::Bignum::AssignHexString(&local_420,value_03);
            uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&local_a2c,&local_420);
            if (uVar2 != 3) {
              uVar7 = CONCAT44(uVar8,(uint)uVar2);
              pcVar3 = "3";
              uVar4 = 0x413;
              uVar5 = 3;
              goto LAB_00824b77;
            }
            bVar1 = double_conversion::Bignum::ToHexString(&local_a2c,(char *)&local_828,0x400);
            if (!bVar1) {
              uVar4 = 0x414;
              goto LAB_00824b9d;
            }
            if (local_820 != '\0' ||
                CONCAT17(uStack_821,CONCAT43(iStack_825,CONCAT12(uStack_826,local_828))) !=
                0x3430303030303031) {
              pcVar3 = "\"10000004\"";
              pcVar6 = "10000004";
              uVar4 = 0x415;
              goto LAB_00824bd5;
            }
            value_04._8_8_ = 8;
            value_04.start_ = "28000000";
            double_conversion::Bignum::AssignHexString(&local_a2c,value_04);
            value_05._8_8_ = 8;
            value_05.start_ = "12A05F20";
            double_conversion::Bignum::AssignHexString(&local_420,value_05);
            uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&local_a2c,&local_420);
            if (uVar2 != 2) {
              uVar7 = CONCAT44(uVar8,(uint)uVar2);
              pcVar3 = "2";
              uVar4 = 0x419;
              uVar5 = 2;
              goto LAB_00824b77;
            }
            bVar1 = double_conversion::Bignum::ToHexString(&local_a2c,(char *)&local_828,0x400);
            if (!bVar1) {
              uVar4 = 0x41a;
              goto LAB_00824b9d;
            }
            if (CONCAT17(uStack_821,CONCAT43(iStack_825,CONCAT12(uStack_826,local_828))) !=
                0x30433134464232) {
              pcVar3 = "\"2BF41C0\"";
              pcVar6 = "2BF41C0";
              uVar4 = 0x41b;
              goto LAB_00824bd5;
            }
            double_conversion::Bignum::AssignUInt16(&local_a2c,10);
            double_conversion::Bignum::ShiftLeft(&local_a2c,500);
            double_conversion::Bignum::AssignBignum(&local_420,&local_a2c);
            double_conversion::Bignum::MultiplyByUInt32(&local_a2c,0x1234);
            double_conversion::Bignum::AssignUInt16(&local_21c,0xfff);
            double_conversion::Bignum::SubtractBignum(&local_420,&local_21c);
            uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&local_a2c,&local_420);
            if (uVar2 != 0x1234) {
              uVar7 = CONCAT44(uVar8,(uint)uVar2);
              uVar4 = 0x423;
              goto LAB_00824af5;
            }
            bVar1 = double_conversion::Bignum::ToHexString(&local_a2c,(char *)&local_828,0x400);
            if (!bVar1) {
              uVar4 = 0x424;
              goto LAB_00824b9d;
            }
            if (CONCAT17(uStack_821,CONCAT43(iStack_825,CONCAT12(uStack_826,local_828))) !=
                0x43434432333231) {
              pcVar3 = "\"1232DCC\"";
              pcVar6 = "1232DCC";
              uVar4 = 0x425;
LAB_00824bd5:
              printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum.cc"
                     ,uVar4,pcVar3,"buffer",pcVar6,&local_828);
              abort();
            }
            uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&local_a2c,&local_420);
            if (uVar2 == 0) {
              bVar1 = double_conversion::Bignum::ToHexString(&local_a2c,(char *)&local_828,0x400);
              if (!bVar1) {
                uVar4 = 0x427;
                goto LAB_00824b9d;
              }
              if (CONCAT17(uStack_821,CONCAT43(iStack_825,CONCAT12(uStack_826,local_828))) ==
                  0x43434432333231) {
                return;
              }
              pcVar3 = "\"1232DCC\"";
              pcVar6 = "1232DCC";
              uVar4 = 0x428;
              goto LAB_00824bd5;
            }
            uVar7 = CONCAT44(uVar8,(uint)uVar2);
            uVar4 = 0x426;
          }
          else {
            uVar7 = CONCAT44(uVar8,(uint)uVar2);
            uVar4 = 0x407;
          }
          pcVar3 = "0";
          uVar5 = 0;
          goto LAB_00824b77;
        }
        uVar7 = CONCAT44(uVar8,(uint)uVar2);
        uVar4 = 0x3f7;
      }
      else {
        uVar7 = CONCAT44(uVar8,(uint)uVar2);
        uVar4 = 0x3ed;
      }
    }
    else {
      uVar7 = CONCAT44(uVar8,(uint)uVar2);
      uVar4 = 999;
    }
  }
  else {
    uVar7 = CONCAT44(uVar8,(uint)uVar2);
    uVar4 = 0x3df;
  }
LAB_00824972:
  pcVar3 = "5";
  uVar5 = 5;
LAB_00824b77:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum.cc"
         ,uVar4,pcVar3,"bignum.DivideModuloIntBignum(other)",uVar5,uVar7);
  abort();
}

Assistant:

TEST(DivideModuloIntBignum) {
  char buffer[kBufferSize];
  Bignum bignum;
  Bignum other;
  Bignum third;

  bignum.AssignUInt16(10);
  other.AssignUInt16(2);
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  bignum.AssignUInt16(10);
  bignum.ShiftLeft(500);
  other.AssignUInt16(2);
  other.ShiftLeft(500);
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  bignum.AssignUInt16(11);
  other.AssignUInt16(2);
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignUInt16(10);
  bignum.ShiftLeft(500);
  other.AssignUInt16(1);
  bignum.AddBignum(other);
  other.AssignUInt16(2);
  other.ShiftLeft(500);
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignUInt16(10);
  bignum.ShiftLeft(500);
  other.AssignBignum(bignum);
  bignum.MultiplyByUInt32(0x1234);
  third.AssignUInt16(0xFFF);
  bignum.AddBignum(third);
  CHECK_EQ(0x1234, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFF", buffer);

  bignum.AssignUInt16(10);
  AssignHexString(&other, "1234567890");
  CHECK_EQ(0, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);

  AssignHexString(&bignum, "12345678");
  AssignHexString(&other, "3789012");
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("D9861E", buffer);

  AssignHexString(&bignum, "70000001");
  AssignHexString(&other, "1FFFFFFF");
  CHECK_EQ(3, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000004", buffer);

  AssignHexString(&bignum, "28000000");
  AssignHexString(&other, "12A05F20");
  CHECK_EQ(2, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2BF41C0", buffer);

  bignum.AssignUInt16(10);
  bignum.ShiftLeft(500);
  other.AssignBignum(bignum);
  bignum.MultiplyByUInt32(0x1234);
  third.AssignUInt16(0xFFF);
  other.SubtractBignum(third);
  CHECK_EQ(0x1234, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1232DCC", buffer);
  CHECK_EQ(0, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1232DCC", buffer);
}